

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict struct_declaration_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  anon_union_16_10_0af5b411_for_u *paVar1;
  undefined2 uVar2;
  node_t pnVar3;
  node_t pnVar4;
  parse_ctx *ppVar5;
  tpname_t el;
  tpname_t el_00;
  int iVar6;
  node_t_conflict pnVar7;
  node_t_conflict pnVar8;
  node_t_conflict pnVar9;
  node_t_conflict op3;
  node_t_conflict op4;
  char *expected_name;
  node_t op;
  node_t_conflict pnVar10;
  anon_union_16_10_0af5b411_for_u *paVar11;
  c2m_ctx_t pcVar12;
  node *pnVar13;
  pos_t pVar14;
  pos_t pVar15;
  undefined8 uStack_b0;
  tpname_t tStack_a8;
  anon_union_16_10_0af5b411_for_u *paStack_90;
  node_t_conflict pnStack_88;
  node *pnStack_80;
  c2m_ctx_t pcStack_78;
  node_t pnStack_70;
  uint local_64;
  parse_ctx *local_60;
  char *local_58;
  node_t_conflict local_50;
  node_t_conflict local_48;
  parse_ctx *local_40;
  node_t_conflict local_38;
  
  local_40 = c2m_ctx->parse_ctx;
  pnVar10 = (node_t_conflict)0x54;
  pnStack_70 = (node_t)0x197ed3;
  local_64 = no_err_p;
  pnVar7 = new_node(c2m_ctx,N_LIST);
  local_50 = pnVar7;
LAB_00197ee2:
  local_60 = c2m_ctx->parse_ctx;
  pcVar12 = c2m_ctx;
  if (*(short *)local_60->curr_token == 0x117) {
    pnVar10 = (node_t_conflict)(ulong)local_64;
    pnStack_70 = (node_t)0x197f05;
    pnVar8 = st_assert(c2m_ctx,local_64);
  }
  else {
    pnStack_70 = (node_t)0x197f15;
    local_48 = spec_qual_list(c2m_ctx,(int)pnVar10);
    if (local_48 == &err_struct) {
      return &err_struct;
    }
    pnStack_70 = (node_t)0x197f30;
    pnVar8 = new_node(c2m_ctx,N_LIST);
    local_38 = pnVar8;
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x3b) {
      do {
        if (*(short *)local_60->curr_token == 0x3a) {
          pnStack_70 = (node_t)0x19801e;
          pnVar10 = new_node(c2m_ctx,N_IGNORE);
LAB_0019805e:
          pnStack_70 = (node_t)0x198068;
          pnVar7 = new_node(c2m_ctx,N_IGNORE);
        }
        else {
          pnStack_70 = (node_t)0x19802f;
          pnVar10 = declarator(c2m_ctx,local_64);
          if (pnVar10 == &err_struct) {
            return &err_struct;
          }
          pnStack_70 = (node_t)0x198056;
          pnVar7 = try_attr_spec(c2m_ctx,local_60->curr_token->pos,(node_t_conflict *)0x0);
          if (pnVar7 == &err_struct) goto LAB_0019805e;
        }
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3a) {
          pnStack_70 = (node_t)0x198088;
          read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
          pnStack_70 = (node_t)0x198094;
          pnVar8 = cond_expr(c2m_ctx,local_64);
          if (pnVar8 == &err_struct) {
            return &err_struct;
          }
        }
        else {
          pnStack_70 = (node_t)0x1980ab;
          pnVar8 = new_node(c2m_ctx,N_IGNORE);
        }
        pnStack_70 = (node_t)0x1980bd;
        pVar15 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                              (node_t_conflict)(ulong)pnVar10->uid);
        local_58 = pVar15.fname;
        pnStack_70 = (node_t)0x1980d2;
        pnVar9 = new_node(c2m_ctx,N_SHARE);
        pnStack_70 = (node_t)0x1980eb;
        op_append(c2m_ctx,pnVar9,local_48);
        pnStack_70 = (node_t)0x198104;
        pnVar10 = new_node4(c2m_ctx,N_MEMBER,pnVar9,pnVar10,pnVar7,pnVar8);
        pnVar8 = local_38;
        pnStack_70 = (node_t)0x19811f;
        pVar14.lno = (int)pVar15._8_8_;
        pVar14.ln_pos = (int)((ulong)pVar15._8_8_ >> 0x20);
        pVar14.fname = local_58;
        add_pos(c2m_ctx,pnVar10,pVar14);
        pnStack_70 = (node_t)0x19812d;
        op_append(c2m_ctx,pnVar8,pnVar10);
        pnVar7 = local_50;
        pnVar10 = (node_t_conflict)c2m_ctx->parse_ctx;
        uVar2 = (undefined2)((pnVar10->op_link).prev)->code;
        if (uVar2 != N_MUL) goto LAB_00198158;
        pnStack_70 = (node_t)0x19814c;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      } while( true );
    }
    pnStack_70 = (node_t)0x197f59;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar10 = local_48;
    pnStack_70 = (node_t)0x197f6d;
    pVar14 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,(node_t_conflict)(ulong)local_48->uid);
    local_58 = pVar14.fname;
    pnStack_70 = (node_t)0x197f82;
    pnVar9 = new_node(c2m_ctx,N_SHARE);
    pnStack_70 = (node_t)0x197f93;
    op_append(c2m_ctx,pnVar9,pnVar10);
    pnStack_70 = (node_t)0x197f9d;
    pnVar10 = new_node(c2m_ctx,N_IGNORE);
    pnStack_70 = (node_t)0x197faa;
    op3 = new_node(c2m_ctx,N_IGNORE);
    pnStack_70 = (node_t)0x197fb7;
    op4 = new_node(c2m_ctx,N_IGNORE);
    pnVar7 = local_50;
    pnStack_70 = (node_t)0x197fdc;
    pnVar9 = new_node4(c2m_ctx,N_MEMBER,pnVar9,pnVar10,op3,op4);
    pnStack_70 = (node_t)0x197ff2;
    pVar15.lno = (int)pVar14._8_8_;
    pVar15.ln_pos = (int)((ulong)pVar14._8_8_ >> 0x20);
    pVar15.fname = local_58;
    add_pos(c2m_ctx,pnVar9,pVar15);
    pnStack_70 = (node_t)0x198000;
    pnVar10 = pnVar8;
    op_append(c2m_ctx,pnVar8,pnVar9);
  }
  goto LAB_00198179;
LAB_00198158:
  if (uVar2 != N_POST_DEC) {
    if (local_60->record_level != 0) {
      return &err_struct;
    }
    pnStack_70 = (node_t)0x198236;
    expected_name = get_token_name(c2m_ctx,0x3b);
    pnStack_70 = (node_t)0x198241;
    syntax_error(c2m_ctx,expected_name);
    return &err_struct;
  }
  pcVar12 = (c2m_ctx_t)c2m_ctx->recorded_tokens;
  pnStack_70 = (node_t)0x198179;
  read_token(pcVar12);
LAB_00198179:
  if (pnVar8 == &err_struct) {
    return &err_struct;
  }
  if (pnVar8->code == N_LIST) {
    op = (pnVar8->u).ops.head;
    if (op == (node_t)0x0) goto LAB_00198207;
    paVar1 = &pnVar8->u;
    while( true ) {
      pnVar3 = (op->op_link).prev;
      pnVar4 = (op->op_link).next;
      if (pnVar3 == (node_t)0x0) {
        paVar11 = paVar1;
        if ((node_t_conflict)(paVar1->s).s != op) {
          pnStack_70 = (node_t)0x198258;
          struct_declaration_list_cold_1();
          goto LAB_00198258;
        }
      }
      else {
        paVar11 = (anon_union_16_10_0af5b411_for_u *)&(pnVar3->op_link).next;
      }
      (paVar11->ops).head = pnVar4;
      if (pnVar4 == (node_t)0x0) break;
      (pnVar4->op_link).prev = pnVar3;
      (op->op_link).prev = (node_t)0x0;
      (op->op_link).next = (node_t)0x0;
      pnStack_70 = (node_t)0x1981da;
      pcVar12 = c2m_ctx;
      op_append(c2m_ctx,pnVar7,op);
      op = pnVar4;
    }
    if ((node_t_conflict)(pnVar8->u).s.len != op) {
LAB_00198258:
      pnStack_70 = (node_t)typedef_name;
      struct_declaration_list_cold_2();
      pnStack_80 = &err_struct;
      ppVar5 = pcVar12->parse_ctx;
      paStack_90 = paVar1;
      pnStack_88 = pnVar7;
      pcStack_78 = c2m_ctx;
      pnStack_70 = pnVar4;
      if (*(short *)ppVar5->curr_token != 0x103) {
        if (ppVar5->record_level != 0) {
          return &err_struct;
        }
        syntax_error(pcVar12,"identifier");
        return &err_struct;
      }
      pnVar13 = ppVar5->curr_token->node;
      read_token((c2m_ctx_t)pcVar12->recorded_tokens);
      pnVar10 = ppVar5->curr_scope;
      el.scope = pnVar10;
      el.id = pnVar13;
      el._16_8_ = uStack_b0;
      iVar6 = HTAB_tpname_t_do(pcVar12->parse_ctx->tpname_tab,el,HTAB_FIND,&tStack_a8);
      if (iVar6 == 0) {
        do {
          if (pnVar10 == (node_t_conflict)0x0) {
            return &err_struct;
          }
          pnVar10 = (node_t_conflict)pnVar10->attr;
          el_00.scope = pnVar10;
          el_00.id = pnVar13;
          el_00._16_8_ = uStack_b0;
          iVar6 = HTAB_tpname_t_do(pcVar12->parse_ctx->tpname_tab,el_00,HTAB_FIND,&tStack_a8);
        } while (iVar6 == 0);
      }
      if (tStack_a8.typedef_p == 0) {
        pnVar13 = &err_struct;
      }
      return pnVar13;
    }
    (pnVar8->u).ops.tail = pnVar3;
    (op->op_link).prev = (node_t)0x0;
    (op->op_link).next = (node_t)0x0;
    pnVar8 = op;
  }
  pnStack_70 = (node_t)0x198207;
  pnVar10 = pnVar7;
  op_append(c2m_ctx,pnVar7,pnVar8);
LAB_00198207:
  if (*(short *)local_40->curr_token == 0x7d) {
    return pnVar7;
  }
  goto LAB_00197ee2;
}

Assistant:

D (struct_declaration_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r, res, el, next_el;

  res = new_node (c2m_ctx, N_LIST);
  for (;;) {
    P (struct_declaration);
    if (r->code != N_LIST) {
      op_append (c2m_ctx, res, r);
    } else {
      for (el = NL_HEAD (r->u.ops); el != NULL; el = next_el) {
        next_el = NL_NEXT (el);
        NL_REMOVE (r->u.ops, el);
        op_append (c2m_ctx, res, el);
      }
    }
    if (C ('}')) break;
  }
  return res;
}